

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_comment_cpp(CPState *cp)

{
  byte *pbVar1;
  uint *in_RDI;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  uint local_8;
  
  do {
    pbVar1 = *(byte **)(in_RDI + 8);
    *(byte **)(in_RDI + 8) = pbVar1 + 1;
    *in_RDI = (uint)*pbVar1;
    if (*in_RDI == 0x5c) {
      local_8 = cp_get_bs((CPState *)
                          CONCAT17(in_stack_ffffffffffffffe7,
                                   CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)));
    }
    else {
      local_8 = *in_RDI;
    }
    in_stack_ffffffffffffffe7 = local_8 == 10 || local_8 == 0xd;
    in_stack_ffffffffffffffe6 = false;
    if (local_8 != 10 && local_8 != 0xd) {
      in_stack_ffffffffffffffe6 = *in_RDI != 0;
    }
  } while ((bool)in_stack_ffffffffffffffe6 != false);
  return;
}

Assistant:

static void cp_comment_cpp(CPState *cp)
{
  while (!cp_iseol(cp_get(cp)) && cp->c != '\0')
    ;
}